

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-reader.c
# Opt level: O0

bson_reader_t *
bson_reader_new_from_handle(void *handle,bson_reader_read_func_t rf,bson_reader_destroy_func_t df)

{
  bson_reader_handle_t *reader;
  uint8_t *puVar1;
  bson_reader_handle_t *real;
  bson_reader_destroy_func_t df_local;
  bson_reader_read_func_t rf_local;
  void *handle_local;
  
  if (handle == (void *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-reader.c"
            ,0xa8,"bson_reader_new_from_handle","handle");
    abort();
  }
  if (rf == (bson_reader_read_func_t)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-reader.c"
            ,0xa9,"bson_reader_new_from_handle","rf");
    abort();
  }
  reader = (bson_reader_handle_t *)bson_malloc0(0x180);
  reader->type = BSON_READER_HANDLE;
  puVar1 = (uint8_t *)bson_malloc0(0x400);
  reader->data = puVar1;
  reader->handle = handle;
  reader->len = 0x400;
  reader->offset = 0;
  bson_reader_set_read_func((bson_reader_t *)reader,rf);
  if (df != (bson_reader_destroy_func_t)0x0) {
    bson_reader_set_destroy_func((bson_reader_t *)reader,df);
  }
  _bson_reader_handle_fill_buffer(reader);
  return (bson_reader_t *)reader;
}

Assistant:

bson_reader_t *
bson_reader_new_from_handle (void *handle,
                             bson_reader_read_func_t rf,
                             bson_reader_destroy_func_t df)
{
   bson_reader_handle_t *real;

   BSON_ASSERT (handle);
   BSON_ASSERT (rf);

   real = bson_malloc0 (sizeof *real);
   real->type = BSON_READER_HANDLE;
   real->data = bson_malloc0 (1024);
   real->handle = handle;
   real->len = 1024;
   real->offset = 0;

   bson_reader_set_read_func ((bson_reader_t *) real, rf);

   if (df) {
      bson_reader_set_destroy_func ((bson_reader_t *) real, df);
   }

   _bson_reader_handle_fill_buffer (real);

   return (bson_reader_t *) real;
}